

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events.c
# Opt level: O3

void keyboard(mfb_window *window,mfb_key key,mfb_key_mod mod,_Bool isPressed)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  
  if (window == (mfb_window *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = (char *)mfb_get_user_data(window);
  }
  __stream = _stdout;
  pcVar2 = mfb_get_key_name(key);
  fprintf(__stream,"%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n",pcVar1,pcVar2,
          (ulong)isPressed,(ulong)mod);
  if (key == KB_KEY_ESCAPE) {
    mfb_close(window);
    return;
  }
  return;
}

Assistant:

void 
keyboard(struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
    const char *window_title = "";
    if(window) {
        window_title = (const char *) mfb_get_user_data(window);
    }
    fprintf(stdout, "%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n", window_title, mfb_get_key_name(key), isPressed, mod);
    if(key == KB_KEY_ESCAPE) {
        mfb_close(window);
    }    
}